

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.h
# Opt level: O0

void __thiscall QString::QString(QString *this,char *ch)

{
  QByteArrayView *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar1;
  QString *in_stack_ffffffffffffffa8;
  char **in_stack_ffffffffffffffb8;
  storage_type *local_38;
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QByteArrayView::QByteArrayView<const_char_*,_true>(in_RDI,in_stack_ffffffffffffffb8);
  QVar1.m_data = local_38;
  QVar1.m_size = (qsizetype)local_28;
  ::QString::fromUtf8(QVar1);
  QString((QString *)in_RDI,in_stack_ffffffffffffffa8);
  ~QString((QString *)0x10f20b);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QT_ASCII_CAST_WARN inline QString(const char *ch)
        : QString(fromUtf8(ch))
    {}